

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

spv_result_t
spvOpcodeTableNameLookup
          (spv_target_env env,spv_opcode_table table,char *name,spv_opcode_desc *pEntry)

{
  spv_opcode_desc psVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char **ppcVar5;
  uint32_t uVar6;
  int iVar7;
  spv_result_t sVar8;
  size_t __n;
  size_t sVar9;
  ulong uVar10;
  uint32_t aliasIndex;
  ulong uVar11;
  
  if (pEntry == (spv_opcode_desc *)0x0 || name == (char *)0x0) {
    sVar8 = SPV_ERROR_INVALID_POINTER;
  }
  else if (table == (spv_opcode_table)0x0) {
    sVar8 = SPV_ERROR_INVALID_TABLE;
  }
  else {
    __n = strlen(name);
    uVar6 = spvVersionForTargetEnv(env);
    uVar2 = table->count;
    for (uVar10 = 0; uVar10 != uVar2; uVar10 = uVar10 + 1) {
      psVar1 = table->entries + uVar10;
      if ((((table->entries[uVar10].minVersion <= uVar6) && (uVar6 <= psVar1->lastVersion)) ||
          (psVar1->numExtensions != 0)) || (psVar1->numCapabilities != 0)) {
        pcVar4 = psVar1->name;
        sVar9 = strlen(pcVar4);
        if ((__n == sVar9) && (iVar7 = strncmp(name,pcVar4,__n), iVar7 == 0)) {
LAB_00542f97:
          *pEntry = psVar1;
          return SPV_SUCCESS;
        }
        uVar3 = psVar1->numAliases;
        if ((ulong)uVar3 != 0) {
          ppcVar5 = psVar1->aliases;
          for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
            pcVar4 = ppcVar5[uVar11];
            sVar9 = strlen(pcVar4 + 2);
            if ((__n == sVar9) && (iVar7 = strncmp(name,pcVar4 + 2,__n), iVar7 == 0))
            goto LAB_00542f97;
          }
        }
      }
    }
    sVar8 = SPV_ERROR_INVALID_LOOKUP;
  }
  return sVar8;
}

Assistant:

spv_result_t spvOpcodeTableNameLookup(spv_target_env env,
                                      const spv_opcode_table table,
                                      const char* name,
                                      spv_opcode_desc* pEntry) {
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;
  if (!table) return SPV_ERROR_INVALID_TABLE;

  // TODO: This lookup of the Opcode table is suboptimal! Binary sort would be
  // preferable but the table requires sorting on the Opcode name, but it's
  // static const initialized and matches the order of the spec.
  const size_t nameLength = strlen(name);
  const auto version = spvVersionForTargetEnv(env);
  for (uint64_t opcodeIndex = 0; opcodeIndex < table->count; ++opcodeIndex) {
    const spv_opcode_desc_t& entry = table->entries[opcodeIndex];
    // We consider the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if ((version >= entry.minVersion && version <= entry.lastVersion) ||
        entry.numExtensions > 0u || entry.numCapabilities > 0u) {
      // Exact match case.
      if (nameLength == strlen(entry.name) &&
          !strncmp(name, entry.name, nameLength)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
      // Lack of binary search really hurts here. There isn't an easy filter to
      // apply before checking aliases since we need to handle promotion from
      // vendor to KHR/EXT and KHR/EXT to core. It would require a sure-fire way
      // of dropping suffices. Fortunately, most lookup are based on token
      // value.
      //
      // If this was a binary search we could iterate between the lower and
      // upper bounds.
      if (entry.numAliases > 0) {
        for (uint32_t aliasIndex = 0; aliasIndex < entry.numAliases;
             aliasIndex++) {
          // Skip Op prefix. Should this be encoded in the table instead?
          const auto alias = entry.aliases[aliasIndex] + 2;
          const size_t aliasLength = strlen(alias);
          if (nameLength == aliasLength && !strncmp(name, alias, nameLength)) {
            *pEntry = &entry;
            return SPV_SUCCESS;
          }
        }
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}